

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json_encode_options<wchar_t>::~basic_json_encode_options
          (basic_json_encode_options<wchar_t> *this)

{
  ~basic_json_encode_options(this,&VTT);
  basic_json_options_common<wchar_t>::~basic_json_options_common
            ((basic_json_options_common<wchar_t> *)&this->field_0x40);
  operator_delete(this,0x118);
  return;
}

Assistant:

~basic_json_encode_options() = default;